

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::ReferenceRenderer::draw
          (ReferenceRenderer *this,RenderState *renderState,PrimitiveType primitive,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          *vertexBuffer)

{
  size_type sVar1;
  Vertex4RGBA *pVVar2;
  const_reference __x;
  VertexAttrib *local_138;
  undefined1 local_118 [8];
  DrawCommand drawQuadCommand;
  VertexAttrib vertexAttribs [2];
  Vertex4RGBA *v;
  size_t vertexNdx;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> positions;
  PrimitiveList primitives;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
  *vertexBuffer_local;
  PrimitiveType primitive_local;
  RenderState *renderState_local;
  ReferenceRenderer *this_local;
  
  sVar1 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::size
                    (vertexBuffer);
  rr::PrimitiveList::PrimitiveList
            ((PrimitiveList *)
             &positions.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,primitive,(int)sVar1,0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &colors.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&vertexNdx);
  v = (Vertex4RGBA *)0x0;
  while( true ) {
    pVVar2 = (Vertex4RGBA *)
             std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
             size(vertexBuffer);
    if (pVVar2 <= v) break;
    __x = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          operator[](vertexBuffer,(size_type)v);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &colors.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&__x->position);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&vertexNdx,
               &__x->color);
    v = (Vertex4RGBA *)((long)(v->position).m_data + 1);
  }
  local_138 = (VertexAttrib *)&drawQuadCommand.primitives;
  do {
    rr::VertexAttrib::VertexAttrib(local_138);
    local_138 = local_138 + 1;
  } while (local_138 != (VertexAttrib *)((long)&vertexAttribs[1].generic.v + 8));
  drawQuadCommand.primitives._0_4_ = 0;
  drawQuadCommand.primitives._4_4_ = 4;
  vertexAttribs[0]._8_8_ =
       std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::data
                 ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                  &colors.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  vertexAttribs[0].generic.v.uData[2] = 0;
  vertexAttribs[0].generic.v.uData[3] = 4;
  vertexAttribs[1]._8_8_ =
       std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::data
                 ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                  &vertexNdx);
  rr::DrawCommand::DrawCommand
            ((DrawCommand *)local_118,renderState,this->m_renderTarget,this->m_program,2,
             (VertexAttrib *)&drawQuadCommand.primitives,
             (PrimitiveList *)
             &positions.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  rr::Renderer::draw(&this->m_renderer,(DrawCommand *)local_118);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&vertexNdx);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &colors.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void ReferenceRenderer::draw (const rr::RenderState&			renderState,
							  const rr::PrimitiveType			primitive,
							  const std::vector<Vertex4RGBA>&	vertexBuffer)
{
	const rr::PrimitiveList primitives(primitive, (int)vertexBuffer.size(), 0);

	std::vector<tcu::Vec4> positions;
	std::vector<tcu::Vec4> colors;

	for (size_t vertexNdx = 0; vertexNdx < vertexBuffer.size(); vertexNdx++)
	{
		const Vertex4RGBA& v = vertexBuffer[vertexNdx];
		positions.push_back(v.position);
		colors.push_back(v.color);
	}

	rr::VertexAttrib vertexAttribs[2];

	// Position attribute
	vertexAttribs[0].type		= rr::VERTEXATTRIBTYPE_FLOAT;
	vertexAttribs[0].size		= 4;
	vertexAttribs[0].pointer	= positions.data();
	// UV attribute
	vertexAttribs[1].type		= rr::VERTEXATTRIBTYPE_FLOAT;
	vertexAttribs[1].size		= 4;
	vertexAttribs[1].pointer	= colors.data();

	rr::DrawCommand drawQuadCommand(renderState, *m_renderTarget, *m_program, 2, vertexAttribs, primitives);

	m_renderer.draw(drawQuadCommand);
}